

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O2

bool __thiscall
ON_PostEffects::MovePostEffectBefore(ON_PostEffects *this,ON_UUID *id_move,ON_UUID *id_before)

{
  ON_SimpleArray<ON_PostEffect_*> *this_00;
  CImpl *this_01;
  ON_PostEffect *pOVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar6;
  undefined8 uVar7;
  ON_PostEffect *pep_move;
  ON_PostEffect *local_38;
  long *plVar5;
  
  bVar2 = ::operator==(id_move,id_before);
  if ((!bVar2) && (uVar3 = CImpl::IndexOfPostEffect(this->_impl,id_move), -1 < (int)uVar3)) {
    this_01 = this->_impl;
    CImpl::EnsurePopulated(this_01);
    this_00 = &this_01->_peps;
    pOVar1 = (this_01->_peps).m_a[uVar3];
    local_38 = pOVar1;
    (*(this_01->_peps)._vptr_ON_SimpleArray[2])(this_00,(ulong)uVar3);
    iVar4 = (*pOVar1->_vptr_ON_PostEffect[0x10])(pOVar1);
    plVar5 = (long *)CONCAT44(extraout_var,iVar4);
    plVar6 = (long *)(**(code **)(*plVar5 + 0x40))(plVar5);
    if (plVar6 != (long *)0x0) {
      bVar2 = ON_UuidIsNil(id_before);
      if (bVar2) {
        uVar7 = (**(code **)(*plVar6 + 0x88))(plVar6,plVar5);
        (**(code **)(*plVar6 + 0x58))(plVar6,uVar7);
        ON_SimpleArray<ON_PostEffect_*>::Append(this_00,&local_38);
      }
      else {
        uVar3 = CImpl::IndexOfPostEffect(this->_impl,id_before);
        if ((int)uVar3 < 0) {
          return false;
        }
        ON_SimpleArray<ON_PostEffect_*>::Insert(this_00,uVar3,&local_38);
        iVar4 = (*(this_01->_peps).m_a[uVar3]->_vptr_ON_PostEffect[0x10])();
        (**(code **)(*plVar5 + 0xa8))(plVar5,iVar4);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffects::MovePostEffectBefore(const ON_UUID& id_move, const ON_UUID& id_before)
{
  if (id_move == id_before)
    return false;

  const int index_move = _impl->IndexOfPostEffect(id_move);
  if (index_move < 0)
    return false;

  auto& pel = _impl->PostEffectList();

  ON_PostEffect* pep_move = pel[index_move];
  pel.Remove(index_move);

  ON_XMLNode& xml_move = pep_move->XMLNode();

  ON_XMLNode* parent = xml_move.Parent();
  if (nullptr == parent)
    return false; // Should never happen.

  if (ON_UuidIsNil(id_before))
  {
    ON_XMLNode* xml_move_detached = parent->DetachChild(xml_move);
    parent->AttachChildNode(xml_move_detached);
    pel.Append(pep_move);
  }
  else
  {
    const int index_before = _impl->IndexOfPostEffect(id_before);
    if (index_before < 0)
      return false;

    pel.Insert(index_before, pep_move);

    ON_XMLNode& xml_before = pel[index_before]->XMLNode();
    xml_move.MoveBefore(xml_before);
  }

  return true;
}